

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_output_chain.c
# Opt level: O2

ngx_int_t ngx_output_chain_as_is(ngx_output_chain_ctx_t *ctx,ngx_buf_t *buf)

{
  ushort uVar1;
  byte bVar2;
  
  uVar1 = *(ushort *)&buf->field_0x48;
  if ((uVar1 & 0xe0) != 0 && (uVar1 & 0x17) == 0) {
    return 1;
  }
  if ((uVar1 & 0x10) == 0) {
LAB_00115fbb:
    bVar2 = ctx->field_0x20;
    if ((bVar2 & 1) != 0) goto LAB_00115fee;
  }
  else {
    if ((buf->file->field_0xc0 & 2) != 0) {
      return 0;
    }
    if (buf->file_pos < 0x80000000) goto LAB_00115fbb;
  }
  if ((uVar1 & 7) == 0) {
    return 0;
  }
  uVar1 = uVar1 & 0xffef;
  *(ushort *)&buf->field_0x48 = uVar1;
  bVar2 = ctx->field_0x20;
LAB_00115fee:
  if (((bVar2 & 8) != 0) && ((uVar1 & 7) == 0)) {
    return 0;
  }
  return (ulong)((uVar1 & 6) == 0 || (bVar2 & 0x10) == 0);
}

Assistant:

static ngx_inline ngx_int_t
ngx_output_chain_as_is(ngx_output_chain_ctx_t *ctx, ngx_buf_t *buf)
{
    ngx_uint_t  sendfile;

    if (ngx_buf_special(buf)) {
        return 1;
    }

#if (NGX_THREADS)
    if (buf->in_file) {
        buf->file->thread_handler = ctx->thread_handler;
        buf->file->thread_ctx = ctx->filter_ctx;
    }
#endif

    if (buf->in_file && buf->file->directio) {
        return 0;
    }

    sendfile = ctx->sendfile;

#if (NGX_SENDFILE_LIMIT)

    if (buf->in_file && buf->file_pos >= NGX_SENDFILE_LIMIT) {
        sendfile = 0;
    }

#endif

    if (!sendfile) {

        if (!ngx_buf_in_memory(buf)) {
            return 0;
        }

        buf->in_file = 0;
    }

#if (NGX_HAVE_AIO_SENDFILE)
    if (ctx->aio_preload && buf->in_file) {
        (void) ngx_output_chain_aio_setup(ctx, buf->file);
    }
#endif

    if (ctx->need_in_memory && !ngx_buf_in_memory(buf)) {
        return 0;
    }

    if (ctx->need_in_temp && (buf->memory || buf->mmap)) {
        return 0;
    }

    return 1;
}